

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O2

bool __thiscall
cappuccino::
lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_insert_update(lru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
                   *this,unsigned_long *key,
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,allow a)

{
  iterator keyed_position;
  
  keyed_position =
       std::
       _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(this + 0x48),key);
  if (keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((a & insert) == 0) {
      return false;
    }
    do_insert(this,key,value);
  }
  else {
    if ((a & update) == 0) {
      return false;
    }
    do_update(this,(keyed_iterator)
                   keyed_position.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
                   _M_cur,value);
  }
  return true;
}

Assistant:

auto do_insert_update(const key_type& key, value_type&& value, allow a) -> bool
    {
        auto keyed_position = m_keyed_elements.find(key);
        if (keyed_position != m_keyed_elements.end())
        {
            if (update_allowed(a))
            {
                do_update(keyed_position, std::move(value));
                return true;
            }
        }
        else
        {
            if (insert_allowed(a))
            {
                do_insert(key, std::move(value));
                return true;
            }
        }

        return false;
    }